

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableFormatter.cpp
# Opt level: O1

void __thiscall
cali::TableFormatter::TableFormatter(TableFormatter *this,string *fields,string *sort_fields)

{
  _Rb_tree_header *p_Var1;
  TableImpl *__p;
  
  (this->super_Formatter)._vptr_Formatter = (_func_int **)&PTR__TableFormatter_0027acc0;
  __p = (TableImpl *)operator_new(0xc0);
  p_Var1 = &(__p->m_aliases)._M_t._M_impl.super__Rb_tree_header;
  (__p->m_aliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p->m_aliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->m_cols).
  super__Vector_base<cali::TableFormatter::TableImpl::Column,_std::allocator<cali::TableFormatter::TableImpl::Column>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->m_cols).
  super__Vector_base<cali::TableFormatter::TableImpl::Column,_std::allocator<cali::TableFormatter::TableImpl::Column>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->m_cols).
  super__Vector_base<cali::TableFormatter::TableImpl::Column,_std::allocator<cali::TableFormatter::TableImpl::Column>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->m_rows).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->m_rows).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->m_rows).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->m_col_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(__p->m_col_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(__p->m_col_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (__p->m_col_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (__p->m_col_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (__p->m_row_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(__p->m_row_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(__p->m_row_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (__p->m_row_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (__p->m_row_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (__p->m_aliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p->m_aliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__p->m_aliases)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __p->m_max_column_width = 0x3c;
  __p->m_print_globals = false;
  (this->mP).super___shared_ptr<cali::TableFormatter::TableImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cali::TableFormatter::TableImpl*>
            (&(this->mP).
              super___shared_ptr<cali::TableFormatter::TableImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  TableImpl::parse((this->mP).
                   super___shared_ptr<cali::TableFormatter::TableImpl,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,fields,sort_fields);
  return;
}

Assistant:

TableFormatter::TableFormatter(const std::string& fields, const std::string& sort_fields) : mP { new TableImpl }
{
    mP->parse(fields, sort_fields);
}